

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O3

void __thiscall Assimp::BlobIOStream::~BlobIOStream(BlobIOStream *this)

{
  ~BlobIOStream(this);
  Intern::AllocateFromAssimpHeap::operator_delete(this);
  return;
}

Assistant:

BlobIOStream :: ~BlobIOStream()
{
    creator->OnDestruct(file,this);
    delete[] buffer;
}